

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::FollowLinkEntry(cmComputeLinkDepends *this,BFSEntry qe)

{
  pointer pLVar1;
  cmGeneratorTarget *this_00;
  pointer pcVar2;
  pointer pbVar3;
  TargetType TVar4;
  cmLinkInterface *iface;
  const_iterator cVar5;
  cmLinkItem *obj;
  pointer pcVar6;
  pointer __k;
  cmLinkItem *oi;
  
  if (qe.GroupIndex == 0xffffffffffffffff) {
    qe.GroupIndex = qe.Index;
  }
  pLVar1 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = pLVar1[qe.Index].Target;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    iface = cmGeneratorTarget::GetLinkInterface(this_00,&this->Config,this->Target);
    if (iface != (cmLinkInterface *)0x0) {
      TVar4 = cmGeneratorTarget::GetType(pLVar1[qe.Index].Target);
      AddLinkEntries<cmLinkItem>
                (this,qe.GroupIndex,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      pcVar2 = (iface->super_cmLinkInterfaceLibraries).Objects.
               super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar6 = (iface->super_cmLinkInterfaceLibraries).Objects.
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_start; pcVar6 != pcVar2; pcVar6 = pcVar6 + 1) {
        AddLinkObject(this,pcVar6);
      }
      __k = (iface->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (iface->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__k != pbVar3) {
        do {
          cVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(iface->LanguageRuntimeLibraries)._M_h,__k);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            AddLinkEntries<cmLinkItem>
                      (this,qe.GroupIndex,
                       (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                       ((long)cVar5.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
                              ._M_cur + 0x28));
          }
          __k = __k + 1;
        } while (__k != pbVar3);
      }
      if (TVar4 != INTERFACE_LIBRARY) {
        FollowSharedDeps(this,qe.GroupIndex,iface,false);
        pcVar2 = (iface->WrongConfigLibraries).
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pcVar6 = (iface->WrongConfigLibraries).
                      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                      super__Vector_impl_data._M_start; pcVar6 != pcVar2; pcVar6 = pcVar6 + 1) {
          CheckWrongConfigItem(this,pcVar6);
        }
      }
    }
    return;
  }
  AddVarLinkEntries(this,qe.GroupIndex,qe.LibDepends);
  return;
}

Assistant:

void cmComputeLinkDepends::FollowLinkEntry(BFSEntry qe)
{
  // Get this entry representation.
  size_t depender_index =
    qe.GroupIndex == cmComputeComponentGraph::INVALID_COMPONENT
    ? qe.Index
    : qe.GroupIndex;
  LinkEntry const& entry = this->EntryList[qe.Index];

  // Follow the item's dependencies.
  if (entry.Target) {
    // Follow the target dependencies.
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      const bool isIface =
        entry.Target->GetType() == cmStateEnums::INTERFACE_LIBRARY;
      // This target provides its own link interface information.
      this->AddLinkEntries(depender_index, iface->Libraries);
      this->AddLinkObjects(iface->Objects);
      for (auto const& language : iface->Languages) {
        auto runtimeEntries = iface->LanguageRuntimeLibraries.find(language);
        if (runtimeEntries != iface->LanguageRuntimeLibraries.end()) {
          this->AddLinkEntries(depender_index, runtimeEntries->second);
        }
      }

      if (isIface) {
        return;
      }

      // Handle dependent shared libraries.
      this->FollowSharedDeps(depender_index, iface);

      // Support for CMP0003.
      for (cmLinkItem const& oi : iface->WrongConfigLibraries) {
        this->CheckWrongConfigItem(oi);
      }
    }
  } else {
    // Follow the old-style dependency list.
    this->AddVarLinkEntries(depender_index, qe.LibDepends);
  }
}